

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O2

void put_demapped_rgb(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  byte bVar1;
  JDIMENSION JVar2;
  JSAMPARRAY ppJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  JSAMPROW pJVar7;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var8;
  long lVar9;
  
  ppJVar3 = cinfo->colormap;
  pJVar4 = *ppJVar3;
  pJVar5 = ppJVar3[1];
  pJVar6 = ppJVar3[2];
  p_Var8 = dinfo[1].start_output;
  pJVar7 = *dinfo->buffer;
  JVar2 = cinfo->output_width;
  for (lVar9 = 0; JVar2 != (JDIMENSION)lVar9; lVar9 = lVar9 + 1) {
    bVar1 = pJVar7[lVar9];
    *p_Var8 = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar4[bVar1];
    p_Var8[1] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar5[bVar1];
    p_Var8[2] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar6[bVar1];
    p_Var8 = p_Var8 + 3;
  }
  fwrite(dinfo[1].start_output,1,(size_t)dinfo[1].finish_output,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_demapped_rgb(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                 JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register int pixval;
  register JSAMPROW ptr;
  register JSAMPROW color_map0 = cinfo->colormap[0];
  register JSAMPROW color_map1 = cinfo->colormap[1];
  register JSAMPROW color_map2 = cinfo->colormap[2];
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    pixval = *ptr++;
    PUTPPMSAMPLE(bufferptr, color_map0[pixval]);
    PUTPPMSAMPLE(bufferptr, color_map1[pixval]);
    PUTPPMSAMPLE(bufferptr, color_map2[pixval]);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}